

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

void crnlib::sort_color_endpoints
               (vector<unsigned_short> *remapping,unpacked_endpoint *unpacked_endpoints,uint16 n)

{
  unsigned_short uVar1;
  undefined2 uVar2;
  uint uVar3;
  uint uVar4;
  unpacked_endpoint *puVar5;
  unsigned_short *puVar6;
  unpacked_endpoint *this;
  ulong uVar7;
  uint error;
  unpacked_endpoint *endpoint;
  uint local_60;
  ushort local_5c;
  uint16 i_1;
  uint min_error;
  uint16 selected_index;
  uint16 left;
  unpacked_endpoint selected_endpoint;
  uint16 i;
  undefined1 local_40 [8];
  vector<unsigned_short> indices;
  vector<crnlib::optimize_color_params::unpacked_endpoint> endpoints;
  uint16 n_local;
  unpacked_endpoint *unpacked_endpoints_local;
  vector<unsigned_short> *remapping_local;
  
  vector<unsigned_short>::resize(remapping,(uint)n,false);
  vector<crnlib::optimize_color_params::unpacked_endpoint>::vector
            ((vector<crnlib::optimize_color_params::unpacked_endpoint> *)&indices.m_size,(uint)n);
  vector<unsigned_short>::vector((vector<unsigned_short> *)local_40,(uint)n);
  for (selected_endpoint.low.field_0.m_u32._2_2_ = 0;
      (ushort)selected_endpoint.low.field_0.m_u32._2_2_ < n;
      selected_endpoint.low.field_0.m_u32._2_2_ = selected_endpoint.low.field_0.m_u32._2_2_ + 1) {
    uVar7 = (ulong)(ushort)selected_endpoint.low.field_0.m_u32._2_2_;
    puVar5 = vector<crnlib::optimize_color_params::unpacked_endpoint>::operator[]
                       ((vector<crnlib::optimize_color_params::unpacked_endpoint> *)&indices.m_size,
                        (uint)(ushort)selected_endpoint.low.field_0.m_u32._2_2_);
    optimize_color_params::unpacked_endpoint::operator=(puVar5,unpacked_endpoints + uVar7);
    uVar2 = selected_endpoint.low.field_0.m_u32._2_2_;
    puVar6 = vector<unsigned_short>::operator[]
                       ((vector<unsigned_short> *)local_40,
                        (uint)(ushort)selected_endpoint.low.field_0.m_u32._2_2_);
    *puVar6 = uVar2;
  }
  color_quad<unsigned_char,_int>::color_quad((color_quad<unsigned_char,_int> *)&min_error,0,0xff);
  color_quad<unsigned_char,_int>::color_quad
            ((color_quad<unsigned_char,_int> *)&selected_index,0,0xff);
  i_1 = n;
  while (i_1 != 0) {
    local_5c = 0;
    local_60 = 0xffffffff;
    for (endpoint._6_2_ = 0; endpoint._6_2_ < i_1; endpoint._6_2_ = endpoint._6_2_ + 1) {
      puVar5 = vector<crnlib::optimize_color_params::unpacked_endpoint>::operator[]
                         ((vector<crnlib::optimize_color_params::unpacked_endpoint> *)
                          &indices.m_size,(uint)endpoint._6_2_);
      uVar3 = color::elucidian_distance(&puVar5->low,(color_quad_u8 *)&min_error,false);
      uVar4 = color::elucidian_distance(&puVar5->high,(color_quad_u8 *)&selected_index,false);
      if (uVar3 + uVar4 < local_60) {
        local_5c = endpoint._6_2_;
        local_60 = uVar3 + uVar4;
      }
    }
    puVar5 = vector<crnlib::optimize_color_params::unpacked_endpoint>::operator[]
                       ((vector<crnlib::optimize_color_params::unpacked_endpoint> *)&indices.m_size,
                        (uint)local_5c);
    optimize_color_params::unpacked_endpoint::operator=((unpacked_endpoint *)&min_error,puVar5);
    puVar6 = vector<unsigned_short>::operator[]((vector<unsigned_short> *)local_40,(uint)local_5c);
    puVar6 = vector<unsigned_short>::operator[](remapping,(uint)*puVar6);
    *puVar6 = n - i_1;
    i_1 = i_1 - 1;
    puVar5 = vector<crnlib::optimize_color_params::unpacked_endpoint>::operator[]
                       ((vector<crnlib::optimize_color_params::unpacked_endpoint> *)&indices.m_size,
                        (uint)i_1);
    this = vector<crnlib::optimize_color_params::unpacked_endpoint>::operator[]
                     ((vector<crnlib::optimize_color_params::unpacked_endpoint> *)&indices.m_size,
                      (uint)local_5c);
    optimize_color_params::unpacked_endpoint::operator=(this,puVar5);
    puVar6 = vector<unsigned_short>::operator[]((vector<unsigned_short> *)local_40,(uint)i_1);
    uVar1 = *puVar6;
    puVar6 = vector<unsigned_short>::operator[]((vector<unsigned_short> *)local_40,(uint)local_5c);
    *puVar6 = uVar1;
  }
  vector<unsigned_short>::~vector((vector<unsigned_short> *)local_40);
  vector<crnlib::optimize_color_params::unpacked_endpoint>::~vector
            ((vector<crnlib::optimize_color_params::unpacked_endpoint> *)&indices.m_size);
  return;
}

Assistant:

static void sort_color_endpoints(crnlib::vector<uint16>& remapping, const optimize_color_params::unpacked_endpoint* unpacked_endpoints, uint16 n)
    {
        remapping.resize(n);
        crnlib::vector<optimize_color_params::unpacked_endpoint> endpoints(n);
        crnlib::vector<uint16> indices(n);
        for (uint16 i = 0; i < n; i++)
        {
            endpoints[i] = unpacked_endpoints[i];
            indices[i] = i;
        }
        optimize_color_params::unpacked_endpoint selected_endpoint = { color_quad_u8(0), color_quad_u8(0) };
        for (uint16 left = n; left;)
        {
            uint16 selected_index = 0;
            uint min_error = cUINT32_MAX;
            for (uint16 i = 0; i < left; i++)
            {
                optimize_color_params::unpacked_endpoint& endpoint = endpoints[i];
                uint error = color::elucidian_distance(endpoint.low, selected_endpoint.low, false) + color::elucidian_distance(endpoint.high, selected_endpoint.high, false);
                if (error < min_error)
                {
                    min_error = error;
                    selected_index = i;
                }
            }
            selected_endpoint = endpoints[selected_index];
            remapping[indices[selected_index]] = n - left;
            left--;
            endpoints[selected_index] = endpoints[left];
            indices[selected_index] = indices[left];
        }
    }